

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QList<QCss::StyleRule> * __thiscall
QStyleSheetStyle::styleRules
          (QList<QCss::StyleRule> *__return_storage_ptr__,QStyleSheetStyle *this,QObject *obj)

{
  byte bVar1;
  Span *pSVar2;
  Entry *pEVar3;
  Data *pDVar4;
  Span *pSVar5;
  Entry *pEVar6;
  int *piVar7;
  QStyleSheetStyleCaches *pQVar8;
  StyleRule *pSVar9;
  qsizetype qVar10;
  Data *pDVar11;
  MediaRule *pMVar12;
  Data *pDVar13;
  PageRule *pPVar14;
  Data *pDVar15;
  AnimationRule *pAVar16;
  Data *pDVar17;
  ImportRule *pIVar18;
  Data *pDVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  StyleRule *pSVar22;
  Data *pDVar23;
  MediaRule *pMVar24;
  qsizetype qVar25;
  Data *pDVar26;
  PageRule *pPVar27;
  Data *pDVar28;
  AnimationRule *pAVar29;
  Data *pDVar30;
  ImportRule *pIVar31;
  Data *pDVar32;
  bool bVar33;
  char cVar34;
  QObject *pQVar35;
  undefined4 *puVar36;
  QDebug *pQVar37;
  pointer pSVar38;
  ulong uVar39;
  QHash<const_void_*,_QCss::StyleSheet> *this_00;
  int iVar40;
  CaseSensitivity CVar41;
  QStyleSheetStyle *this_01;
  ulong uVar42;
  StyleSheet *pSVar43;
  long lVar44;
  int iVar45;
  long in_FS_OFFSET;
  QLatin1String QVar46;
  QStringView QVar47;
  const_iterator cVar48;
  const_iterator cVar49;
  QStringView QVar50;
  QDebug local_250;
  undefined1 local_248 [8];
  QString local_240;
  QString local_228;
  void *copy;
  StyleSheet *pSStack_200;
  ulong local_1f8;
  QObject local_1f0 [8];
  StyleSheet local_1e8;
  undefined **local_148;
  QList<QCss::StyleSheet> local_140;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  QHash<const_QObject_*,_QHash<QString,_QString>_> local_108;
  QObject *obj_local;
  undefined1 local_f8 [32];
  QObject *copy_1;
  StyleRule *pSStack_d0;
  long local_c8;
  QArrayDataPointer<QCss::MediaRule> local_c0;
  QArrayDataPointer<QCss::PageRule> local_a8;
  QArrayDataPointer<QCss::AnimationRule> local_90;
  QArrayDataPointer<QCss::ImportRule> local_78;
  undefined8 local_60;
  QMultiHash<QString,_QCss::StyleRule> local_58;
  QMultiHash<QString,_QCss::StyleRule> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QStyleSheetStyle *)&styleSheetCaches->styleRulesCache;
  obj_local = obj;
  cVar48 = QHash<QObject_const*,QList<QCss::StyleRule>>::constFindImpl<QObject_const*>
                     ((QHash<QObject_const*,QList<QCss::StyleRule>> *)this_01,&obj_local);
  if (cVar48.i.d == (Data<QHashPrivate::Node<const_QObject_*,_QList<QCss::StyleRule>_>_> *)0x0 &&
      cVar48.i.bucket == 0) {
    bVar33 = initObject(this_01,obj_local);
    if (bVar33) {
      local_140.d.d = (Data *)0x0;
      local_140.d.ptr = (StyleSheet *)0x0;
      local_140.d.size = 0;
      uStack_128 = 0;
      local_120 = 0;
      uStack_118 = 0;
      local_110 = 0xaaaaaaaa00000001;
      local_148 = &PTR__QStyleSheetStyleSelector_007ea2a0;
      local_108.d = (Data *)0x0;
      memset(&local_1e8,0,0xa0);
      this_00 = &styleSheetCaches->styleSheetCache;
      copy_1 = &baseStyle(this)->super_QObject;
      cVar49 = QHash<void_const*,QCss::StyleSheet>::constFindImpl<void_const*>
                         ((QHash<void_const*,QCss::StyleSheet> *)this_00,&copy_1);
      if (cVar49.i.d == (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)0x0 &&
          cVar49.i.bucket == 0) {
        getDefaultStyleSheet((StyleSheet *)&copy_1,this);
        lVar44 = local_c8;
        pSVar22 = pSStack_d0;
        pQVar35 = copy_1;
        qVar10 = local_1e8.styleRules.d.size;
        pSVar9 = local_1e8.styleRules.d.ptr;
        pDVar4 = local_1e8.styleRules.d.d;
        local_c8 = 0;
        copy_1 = (QObject *)0x0;
        pSStack_d0 = (StyleRule *)0x0;
        local_1e8.styleRules.d.d = (Data *)pQVar35;
        local_1e8.styleRules.d.ptr = pSVar22;
        local_f8._0_4_ = SUB84(pDVar4,0);
        local_f8._4_4_ = (undefined4)((ulong)pDVar4 >> 0x20);
        local_f8._8_4_ = SUB84(pSVar9,0);
        local_f8._12_4_ = (undefined4)((ulong)pSVar9 >> 0x20);
        local_1e8.styleRules.d.size = lVar44;
        local_f8._16_4_ = (undefined4)qVar10;
        local_f8._20_4_ = (undefined4)((ulong)qVar10 >> 0x20);
        QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::StyleRule> *)local_f8);
        qVar25 = local_c0.size;
        pMVar24 = local_c0.ptr;
        pDVar23 = local_c0.d;
        qVar10 = local_1e8.mediaRules.d.size;
        pMVar12 = local_1e8.mediaRules.d.ptr;
        pDVar11 = local_1e8.mediaRules.d.d;
        local_c0.size = 0;
        local_c0.d = (Data *)0x0;
        local_c0.ptr = (MediaRule *)0x0;
        local_1e8.mediaRules.d.d = pDVar23;
        local_1e8.mediaRules.d.ptr = pMVar24;
        local_f8._0_4_ = SUB84(pDVar11,0);
        local_f8._4_4_ = (undefined4)((ulong)pDVar11 >> 0x20);
        local_f8._8_4_ = SUB84(pMVar12,0);
        local_f8._12_4_ = (undefined4)((ulong)pMVar12 >> 0x20);
        local_1e8.mediaRules.d.size = qVar25;
        local_f8._16_4_ = (undefined4)qVar10;
        local_f8._20_4_ = (undefined4)((ulong)qVar10 >> 0x20);
        QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::MediaRule> *)local_f8);
        qVar25 = local_a8.size;
        pPVar27 = local_a8.ptr;
        pDVar26 = local_a8.d;
        qVar10 = local_1e8.pageRules.d.size;
        pPVar14 = local_1e8.pageRules.d.ptr;
        pDVar13 = local_1e8.pageRules.d.d;
        local_a8.size = 0;
        local_a8.d = (Data *)0x0;
        local_a8.ptr = (PageRule *)0x0;
        local_1e8.pageRules.d.d = pDVar26;
        local_1e8.pageRules.d.ptr = pPVar27;
        local_f8._0_4_ = SUB84(pDVar13,0);
        local_f8._4_4_ = (undefined4)((ulong)pDVar13 >> 0x20);
        local_f8._8_4_ = SUB84(pPVar14,0);
        local_f8._12_4_ = (undefined4)((ulong)pPVar14 >> 0x20);
        local_1e8.pageRules.d.size = qVar25;
        local_f8._16_4_ = (undefined4)qVar10;
        local_f8._20_4_ = (undefined4)((ulong)qVar10 >> 0x20);
        QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::PageRule> *)local_f8);
        qVar25 = local_90.size;
        pAVar29 = local_90.ptr;
        pDVar28 = local_90.d;
        qVar10 = local_1e8.animationRules.d.size;
        pAVar16 = local_1e8.animationRules.d.ptr;
        pDVar15 = local_1e8.animationRules.d.d;
        local_90.size = 0;
        local_90.d = (Data *)0x0;
        local_90.ptr = (AnimationRule *)0x0;
        local_1e8.animationRules.d.d = pDVar28;
        local_1e8.animationRules.d.ptr = pAVar29;
        local_f8._0_4_ = SUB84(pDVar15,0);
        local_f8._4_4_ = (undefined4)((ulong)pDVar15 >> 0x20);
        local_f8._8_4_ = SUB84(pAVar16,0);
        local_f8._12_4_ = (undefined4)((ulong)pAVar16 >> 0x20);
        local_1e8.animationRules.d.size = qVar25;
        local_f8._16_4_ = (undefined4)qVar10;
        local_f8._20_4_ = (undefined4)((ulong)qVar10 >> 0x20);
        QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::AnimationRule> *)local_f8);
        qVar25 = local_78.size;
        pIVar31 = local_78.ptr;
        pDVar30 = local_78.d;
        qVar10 = local_1e8.importRules.d.size;
        pIVar18 = local_1e8.importRules.d.ptr;
        pDVar17 = local_1e8.importRules.d.d;
        local_78.size = 0;
        local_78.d = (Data *)0x0;
        local_78.ptr = (ImportRule *)0x0;
        local_1e8.importRules.d.d = pDVar30;
        local_1e8.importRules.d.ptr = pIVar31;
        local_f8._0_4_ = SUB84(pDVar17,0);
        local_f8._4_4_ = (undefined4)((ulong)pDVar17 >> 0x20);
        local_f8._8_4_ = SUB84(pIVar18,0);
        local_f8._12_4_ = (undefined4)((ulong)pIVar18 >> 0x20);
        local_1e8.importRules.d.size = qVar25;
        local_f8._16_4_ = (undefined4)qVar10;
        local_f8._20_4_ = (undefined4)((ulong)qVar10 >> 0x20);
        QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::ImportRule> *)local_f8);
        qVar25 = local_58.m_size;
        pDVar32 = local_58.d;
        qVar10 = local_1e8.nameIndex.m_size;
        pDVar19 = local_1e8.nameIndex.d;
        local_1e8.origin = (StyleSheetOrigin)local_60;
        local_1e8.depth = local_60._4_4_;
        local_58.d = (Data *)0x0;
        local_58.m_size = 0;
        local_1e8.nameIndex.d = pDVar32;
        local_1e8.nameIndex.m_size = qVar25;
        local_f8._0_4_ = SUB84(pDVar19,0);
        local_f8._4_4_ = (undefined4)((ulong)pDVar19 >> 0x20);
        local_f8._8_4_ = (undefined4)qVar10;
        local_f8._12_4_ = (undefined4)((ulong)qVar10 >> 0x20);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash
                  ((QMultiHash<QString,_QCss::StyleRule> *)local_f8);
        qVar25 = local_48.m_size;
        pDVar32 = local_48.d;
        qVar10 = local_1e8.idIndex.m_size;
        pDVar19 = local_1e8.idIndex.d;
        local_48.d = (Data *)0x0;
        local_48.m_size = 0;
        local_1e8.idIndex.d = pDVar32;
        local_1e8.idIndex.m_size = qVar25;
        local_f8._0_4_ = SUB84(pDVar19,0);
        local_f8._4_4_ = (undefined4)((ulong)pDVar19 >> 0x20);
        local_f8._8_4_ = (undefined4)qVar10;
        local_f8._12_4_ = (undefined4)((ulong)qVar10 >> 0x20);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash
                  ((QMultiHash<QString,_QCss::StyleRule> *)local_f8);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_48);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_58);
        QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer(&local_90);
        QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer(&local_a8);
        QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer(&local_c0);
        QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::StyleRule> *)&copy_1);
        pQVar35 = &baseStyle(this)->super_QObject;
        copy_1 = pQVar35;
        QHash<void_const*,QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                  ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,&copy_1
                   ,&local_1e8);
        pQVar8 = styleSheetCaches;
        local_f8._0_4_ = (__atomic_base<int>)0x3578a8;
        local_f8._4_4_ = 0;
        local_f8._8_4_ = 0;
        local_f8._12_4_ = 0;
        copy_1 = (QObject *)QObject::destroyed;
        pSStack_d0 = (StyleRule *)0x0;
        puVar36 = (undefined4 *)operator_new(0x20);
        *puVar36 = 1;
        *(code **)(puVar36 + 2) =
             QtPrivate::
             QCallableObject<void_(QStyleSheetStyleCaches::*)(QObject_*),_QtPrivate::List<QObject_*>,_void>
             ::impl;
        *(code **)(puVar36 + 4) = QStyleSheetStyleCaches::styleDestroyed;
        *(undefined8 *)(puVar36 + 6) = 0;
        QObject::connectImpl
                  (local_1f0,(void **)pQVar35,(QObject *)&copy_1,(void **)pQVar8,
                   (QSlotObjectBase *)local_f8,(ConnectionType)puVar36,(int *)0x0,(QMetaObject *)0x0
                  );
        QMetaObject::Connection::~Connection((Connection *)local_1f0);
      }
      else {
        pSVar5 = (cVar49.i.d)->spans;
        uVar39 = cVar49.i.bucket >> 7;
        pEVar6 = pSVar5[uVar39].entries;
        bVar1 = pSVar5[uVar39].offsets[(uint)cVar49.i.bucket & 0x7f];
        QArrayDataPointer<QCss::StyleRule>::operator=
                  ((QArrayDataPointer<QCss::StyleRule> *)&local_1e8,
                   (QArrayDataPointer<QCss::StyleRule> *)(pEVar6[bVar1].storage.data + 8));
        QArrayDataPointer<QCss::MediaRule>::operator=
                  (&local_1e8.mediaRules.d,
                   (QArrayDataPointer<QCss::MediaRule> *)(pEVar6[bVar1].storage.data + 0x20));
        QArrayDataPointer<QCss::PageRule>::operator=
                  (&local_1e8.pageRules.d,
                   (QArrayDataPointer<QCss::PageRule> *)(pEVar6[bVar1].storage.data + 0x38));
        QArrayDataPointer<QCss::AnimationRule>::operator=
                  (&local_1e8.animationRules.d,
                   (QArrayDataPointer<QCss::AnimationRule> *)(pEVar6[bVar1].storage.data + 0x50));
        QArrayDataPointer<QCss::ImportRule>::operator=
                  (&local_1e8.importRules.d,
                   (QArrayDataPointer<QCss::ImportRule> *)(pEVar6[bVar1].storage.data + 0x68));
        local_1e8._120_8_ = *(undefined8 *)(pEVar6[bVar1].storage.data + 0x80);
        QMultiHash<QString,_QCss::StyleRule>::operator=
                  (&local_1e8.nameIndex,
                   (QMultiHash<QString,_QCss::StyleRule> *)(pEVar6[bVar1].storage.data + 0x88));
        QMultiHash<QString,_QCss::StyleRule>::operator=
                  (&local_1e8.idIndex,
                   (QMultiHash<QString,_QCss::StyleRule> *)(pEVar6[bVar1].storage.data + 0x98));
      }
      QtPrivate::QMovableArrayOps<QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                ((QMovableArrayOps<QCss::StyleSheet> *)&local_140,local_140.d.size,&local_1e8);
      QList<QCss::StyleSheet>::end(&local_140);
      QApplication::styleSheet((QString *)&copy_1,QCoreApplication::self);
      lVar44 = local_c8;
      if (copy_1 != (QObject *)0x0) {
        LOCK();
        *(int *)copy_1 = *(int *)copy_1 + -1;
        UNLOCK();
        if (*(int *)copy_1 == 0) {
          QArrayData::deallocate((QArrayData *)copy_1,2,0x10);
        }
      }
      if (lVar44 != 0) {
        memset(&copy_1,0,0xa0);
        local_f8._0_4_ = SUB84(QCoreApplication::self,0);
        local_f8._4_4_ = (undefined4)((ulong)QCoreApplication::self >> 0x20);
        cVar49 = QHash<void_const*,QCss::StyleSheet>::constFindImpl<void_const*>
                           ((QHash<void_const*,QCss::StyleSheet> *)
                            &styleSheetCaches->styleSheetCache,(void **)local_f8);
        if (cVar49.i.d == (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)0x0 &&
            cVar49.i.bucket == 0) {
          local_f8._16_4_ = 0xaaaaaaaa;
          local_f8._20_4_ = 0xaaaaaaaa;
          local_f8._0_4_ = (__atomic_base<int>)0xaaaaaaaa;
          local_f8._4_4_ = 0xaaaaaaaa;
          local_f8._8_4_ = 0xaaaaaaaa;
          local_f8._12_4_ = 0xaaaaaaaa;
          QApplication::styleSheet((QString *)local_f8,QCoreApplication::self);
          QVar46.m_data = (char *)0x8;
          QVar46.m_size = (qsizetype)local_f8;
          cVar34 = QString::startsWith(QVar46,0x660b9a);
          if (cVar34 != '\0') {
            QString::remove((longlong)local_f8,0);
          }
          QApplication::styleSheet((QString *)&copy,QCoreApplication::self);
          if (local_1f8 == CONCAT44(local_f8._20_4_,local_f8._16_4_)) {
            QVar50.m_data._4_4_ = local_f8._12_4_;
            QVar50.m_data._0_4_ = local_f8._8_4_;
            QVar47.m_data = (storage_type_conflict *)pSStack_200;
            QVar47.m_size = local_1f8;
            QVar50.m_size = local_1f8;
            QtPrivate::equalStrings(QVar47,QVar50);
          }
          QCss::Parser::init((QString *)(this + 0x20),SUB81((__atomic_base<int> *)local_f8,0));
          if (copy != (void *)0x0) {
            LOCK();
            *(int *)copy = *copy + -1;
            UNLOCK();
            if (*copy == 0) {
              QArrayData::deallocate((QArrayData *)copy,2,0x10);
            }
          }
          cVar34 = QCss::Parser::parse((StyleSheet *)(this + 0x20),(CaseSensitivity)&copy_1);
          if (cVar34 == '\0') {
            styleRules();
          }
          local_60._0_4_ = StyleSheetOrigin_Inline;
          local_60._4_4_ = 1;
          copy = QCoreApplication::self;
          QHash<void_const*,QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                    ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,&copy
                     ,(StyleSheet *)&copy_1);
          piVar7 = (int *)CONCAT44(local_f8._4_4_,local_f8._0_4_);
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              QArrayData::deallocate((QArrayData *)CONCAT44(local_f8._4_4_,local_f8._0_4_),2,0x10);
            }
          }
        }
        else {
          pSVar5 = (cVar49.i.d)->spans;
          uVar39 = cVar49.i.bucket >> 7;
          pEVar6 = pSVar5[uVar39].entries;
          bVar1 = pSVar5[uVar39].offsets[(uint)cVar49.i.bucket & 0x7f];
          QArrayDataPointer<QCss::StyleRule>::operator=
                    ((QArrayDataPointer<QCss::StyleRule> *)&copy_1,
                     (QArrayDataPointer<QCss::StyleRule> *)(pEVar6[bVar1].storage.data + 8));
          QArrayDataPointer<QCss::MediaRule>::operator=
                    (&local_c0,
                     (QArrayDataPointer<QCss::MediaRule> *)(pEVar6[bVar1].storage.data + 0x20));
          QArrayDataPointer<QCss::PageRule>::operator=
                    (&local_a8,
                     (QArrayDataPointer<QCss::PageRule> *)(pEVar6[bVar1].storage.data + 0x38));
          QArrayDataPointer<QCss::AnimationRule>::operator=
                    (&local_90,
                     (QArrayDataPointer<QCss::AnimationRule> *)(pEVar6[bVar1].storage.data + 0x50));
          QArrayDataPointer<QCss::ImportRule>::operator=
                    (&local_78,
                     (QArrayDataPointer<QCss::ImportRule> *)(pEVar6[bVar1].storage.data + 0x68));
          local_60 = *(undefined8 *)(pEVar6[bVar1].storage.data + 0x80);
          QMultiHash<QString,_QCss::StyleRule>::operator=
                    (&local_58,
                     (QMultiHash<QString,_QCss::StyleRule> *)(pEVar6[bVar1].storage.data + 0x88));
          QMultiHash<QString,_QCss::StyleRule>::operator=
                    (&local_48,
                     (QMultiHash<QString,_QCss::StyleRule> *)(pEVar6[bVar1].storage.data + 0x98));
        }
        QtPrivate::QMovableArrayOps<QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                  ((QMovableArrayOps<QCss::StyleSheet> *)&local_140,local_140.d.size,
                   (StyleSheet *)&copy_1);
        QList<QCss::StyleSheet>::end(&local_140);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_48);
        QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_58);
        QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer(&local_90);
        QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer(&local_a8);
        QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer(&local_c0);
        QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                  ((QArrayDataPointer<QCss::StyleRule> *)&copy_1);
      }
      copy = (void *)0x0;
      pSStack_200 = (StyleSheet *)0x0;
      local_1f8 = 0;
      if (obj_local == (QObject *)0x0) {
        uVar39 = 0;
      }
      else {
        pSVar43 = (StyleSheet *)(this + 0x20);
        pQVar35 = obj_local;
        do {
          local_228.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_228.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_228.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QObject::property((char *)&copy_1);
          ::QVariant::toString();
          ::QVariant::~QVariant((QVariant *)&copy_1);
          if ((undefined1 *)local_228.d.size != (undefined1 *)0x0) {
            memset((StyleSheet *)&copy_1,0,0xa0);
            local_f8._0_4_ = SUB84(pQVar35,0);
            uVar20 = local_f8._0_4_;
            local_f8._4_4_ = (undefined4)((ulong)pQVar35 >> 0x20);
            uVar21 = local_f8._4_4_;
            cVar49 = QHash<void_const*,QCss::StyleSheet>::constFindImpl<void_const*>
                               ((QHash<void_const*,QCss::StyleSheet> *)
                                &styleSheetCaches->styleSheetCache,(void **)local_f8);
            if (cVar49.i.d == (Data<QHashPrivate::Node<const_void_*,_QCss::StyleSheet>_> *)0x0 &&
                cVar49.i.bucket == 0) {
              QCss::Parser::init((QString *)pSVar43,SUB81(&local_228,0));
              CVar41 = (CaseSensitivity)(StyleSheet *)&copy_1;
              cVar34 = QCss::Parser::parse(pSVar43,CVar41);
              if (cVar34 == '\0') {
                local_f8._0_4_ = (__atomic_base<int>)0x3;
                local_f8._4_4_ = 0;
                local_f8._8_4_ = 0x6711ff;
                local_f8._12_4_ = 0;
                local_f8._24_2_ = 0x7d;
                local_f8._16_8_ = &local_228;
                QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_char16_t>::
                convertTo<QString>(&local_240,
                                   (QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_char16_t>
                                    *)local_f8);
                QCss::Parser::init((QString *)pSVar43,SUB81(&local_240,0));
                if (&(local_240.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_240.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_240.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_240.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_240.d.d)->super_QArrayData,2,0x10);
                  }
                }
                cVar34 = QCss::Parser::parse(pSVar43,CVar41);
                if (cVar34 == '\0') {
                  local_f8._0_4_ = (__atomic_base<int>)0x2;
                  local_f8._4_4_ = 0;
                  local_f8._8_4_ = 0;
                  local_f8._12_4_ = 0;
                  local_f8._16_4_ = 0;
                  local_f8._20_4_ = 0;
                  local_f8._24_8_ = "default";
                  QMessageLogger::warning();
                  pQVar37 = QDebug::operator<<((QDebug *)&local_240,
                                               "Could not parse stylesheet of object");
                  local_250.stream = pQVar37->stream;
                  *(int *)(local_250.stream + 0x28) = *(int *)(local_250.stream + 0x28) + 1;
                  ::operator<<((Stream *)local_248,(QObject *)&local_250);
                  QDebug::~QDebug((QDebug *)local_248);
                  QDebug::~QDebug(&local_250);
                  QDebug::~QDebug((QDebug *)&local_240);
                }
              }
              local_60._0_4_ = StyleSheetOrigin_Inline;
              local_f8._0_4_ = uVar20;
              local_f8._4_4_ = uVar21;
              QHash<void_const*,QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                        ((QHash<void_const*,QCss::StyleSheet> *)&styleSheetCaches->styleSheetCache,
                         (void **)local_f8,(StyleSheet *)&copy_1);
            }
            else {
              pSVar5 = (cVar49.i.d)->spans;
              uVar39 = cVar49.i.bucket >> 7;
              pEVar6 = pSVar5[uVar39].entries;
              bVar1 = pSVar5[uVar39].offsets[(uint)cVar49.i.bucket & 0x7f];
              QArrayDataPointer<QCss::StyleRule>::operator=
                        ((QArrayDataPointer<QCss::StyleRule> *)&copy_1,
                         (QArrayDataPointer<QCss::StyleRule> *)(pEVar6[bVar1].storage.data + 8));
              QArrayDataPointer<QCss::MediaRule>::operator=
                        (&local_c0,
                         (QArrayDataPointer<QCss::MediaRule> *)(pEVar6[bVar1].storage.data + 0x20));
              QArrayDataPointer<QCss::PageRule>::operator=
                        (&local_a8,
                         (QArrayDataPointer<QCss::PageRule> *)(pEVar6[bVar1].storage.data + 0x38));
              QArrayDataPointer<QCss::AnimationRule>::operator=
                        (&local_90,
                         (QArrayDataPointer<QCss::AnimationRule> *)
                         (pEVar6[bVar1].storage.data + 0x50));
              QArrayDataPointer<QCss::ImportRule>::operator=
                        (&local_78,
                         (QArrayDataPointer<QCss::ImportRule> *)(pEVar6[bVar1].storage.data + 0x68))
              ;
              local_60 = *(undefined8 *)(pEVar6[bVar1].storage.data + 0x80);
              QMultiHash<QString,_QCss::StyleRule>::operator=
                        (&local_58,
                         (QMultiHash<QString,_QCss::StyleRule> *)(pEVar6[bVar1].storage.data + 0x88)
                        );
              QMultiHash<QString,_QCss::StyleRule>::operator=
                        (&local_48,
                         (QMultiHash<QString,_QCss::StyleRule> *)(pEVar6[bVar1].storage.data + 0x98)
                        );
            }
            QtPrivate::QMovableArrayOps<QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
                      ((QMovableArrayOps<QCss::StyleSheet> *)&copy,local_1f8,(StyleSheet *)&copy_1);
            QList<QCss::StyleSheet>::end((QList<QCss::StyleSheet> *)&copy);
            QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_48);
            QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_58);
            QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer(&local_78);
            QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer(&local_90);
            QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer(&local_a8);
            QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer(&local_c0);
            QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                      ((QArrayDataPointer<QCss::StyleRule> *)&copy_1);
          }
          if (&(local_228.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_228.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_228.d.d)->super_QArrayData,2,0x10);
            }
          }
          pQVar35 = parentObject(pQVar35);
        } while (pQVar35 != (QObject *)0x0);
        if (local_1f8 == 0) {
          uVar39 = 0;
        }
        else {
          lVar44 = 0x7c;
          iVar40 = 2;
          uVar42 = 0;
          do {
            iVar45 = (int)local_1f8;
            pSVar38 = QList<QCss::StyleSheet>::data((QList<QCss::StyleSheet> *)&copy);
            *(int *)((long)&(pSVar38->styleRules).d.d + lVar44) = iVar45 + iVar40;
            uVar42 = uVar42 + 1;
            lVar44 = lVar44 + 0xa0;
            iVar40 = iVar40 + -1;
            uVar39 = local_1f8;
          } while (uVar42 < local_1f8);
        }
      }
      QtPrivate::QCommonArrayOps<QCss::StyleSheet>::growAppend
                ((QCommonArrayOps<QCss::StyleSheet> *)&local_140,pSStack_200,pSStack_200 + uVar39);
      (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->d).ptr = (StyleRule *)&DAT_aaaaaaaaaaaaaaaa;
      QCss::StyleSelector::styleRulesForNode((NodePtr)__return_storage_ptr__);
      copy_1 = obj_local;
      QHash<QObject_const*,QList<QCss::StyleRule>>::emplace<QList<QCss::StyleRule>const&>
                ((QHash<QObject_const*,QList<QCss::StyleRule>> *)&styleSheetCaches->styleRulesCache,
                 &copy_1,__return_storage_ptr__);
      QArrayDataPointer<QCss::StyleSheet>::~QArrayDataPointer
                ((QArrayDataPointer<QCss::StyleSheet> *)&copy);
      QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_1e8.idIndex);
      QMultiHash<QString,_QCss::StyleRule>::~QMultiHash(&local_1e8.nameIndex);
      QArrayDataPointer<QCss::ImportRule>::~QArrayDataPointer(&local_1e8.importRules.d);
      QArrayDataPointer<QCss::AnimationRule>::~QArrayDataPointer(&local_1e8.animationRules.d);
      QArrayDataPointer<QCss::PageRule>::~QArrayDataPointer(&local_1e8.pageRules.d);
      QArrayDataPointer<QCss::MediaRule>::~QArrayDataPointer(&local_1e8.mediaRules.d);
      QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer
                ((QArrayDataPointer<QCss::StyleRule> *)&local_1e8);
      local_148 = &PTR__QStyleSheetStyleSelector_007ea2a0;
      QHash<const_QObject_*,_QHash<QString,_QString>_>::~QHash(&local_108);
      QCss::StyleSelector::~StyleSelector((StyleSelector *)&local_148);
    }
    else {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (StyleRule *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
  }
  else {
    pSVar2 = (cVar48.i.d)->spans;
    uVar39 = cVar48.i.bucket >> 7;
    pEVar3 = pSVar2[uVar39].entries;
    bVar1 = pSVar2[uVar39].offsets[(uint)cVar48.i.bucket & 0x7f];
    pDVar4 = *(Data **)(pEVar3[bVar1].storage.data + 8);
    (__return_storage_ptr__->d).d = pDVar4;
    (__return_storage_ptr__->d).ptr = *(StyleRule **)(pEVar3[bVar1].storage.data + 0x10);
    (__return_storage_ptr__->d).size = *(qsizetype *)(pEVar3[bVar1].storage.data + 0x18);
    local_f8._16_8_ = (QString *)CONCAT44(local_f8._20_4_,local_f8._16_4_);
    if (pDVar4 != (Data *)0x0) {
      LOCK();
      (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_f8._16_8_ = (QString *)CONCAT44(local_f8._20_4_,local_f8._16_4_);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QCss::StyleRule> QStyleSheetStyle::styleRules(const QObject *obj) const
{
    QHash<const QObject *, QList<StyleRule>>::const_iterator cacheIt =
            styleSheetCaches->styleRulesCache.constFind(obj);
    if (cacheIt != styleSheetCaches->styleRulesCache.constEnd())
        return cacheIt.value();

    if (!initObject(obj)) {
        return QList<StyleRule>();
    }

    QStyleSheetStyleSelector styleSelector;

    StyleSheet defaultSs;
    QHash<const void *, StyleSheet>::const_iterator defaultCacheIt = styleSheetCaches->styleSheetCache.constFind(baseStyle());
    if (defaultCacheIt == styleSheetCaches->styleSheetCache.constEnd()) {
        defaultSs = getDefaultStyleSheet();
        QStyle *bs = baseStyle();
        styleSheetCaches->styleSheetCache.insert(bs, defaultSs);
        QObject::connect(bs, &QStyle::destroyed, styleSheetCaches,
                         &QStyleSheetStyleCaches::styleDestroyed);
    } else {
        defaultSs = defaultCacheIt.value();
    }
    styleSelector.styleSheets += defaultSs;

    if (!qApp->styleSheet().isEmpty()) {
        StyleSheet appSs;
        QHash<const void *, StyleSheet>::const_iterator appCacheIt = styleSheetCaches->styleSheetCache.constFind(qApp);
        if (appCacheIt == styleSheetCaches->styleSheetCache.constEnd()) {
            QString ss = qApp->styleSheet();
            if (ss.startsWith("file:///"_L1))
                ss.remove(0, 8);
            parser.init(ss, qApp->styleSheet() != ss);
            if (Q_UNLIKELY(!parser.parse(&appSs)))
                qWarning("Could not parse application stylesheet");
            appSs.origin = StyleSheetOrigin_Inline;
            appSs.depth = 1;
            styleSheetCaches->styleSheetCache.insert(qApp, appSs);
        } else {
            appSs = appCacheIt.value();
        }
        styleSelector.styleSheets += appSs;
    }

    QList<QCss::StyleSheet> objectSs;
    for (const QObject *o = obj; o; o = parentObject(o)) {
        QString styleSheet = o->property("styleSheet").toString();
        if (styleSheet.isEmpty())
            continue;
        StyleSheet ss;
        QHash<const void *, StyleSheet>::const_iterator objCacheIt = styleSheetCaches->styleSheetCache.constFind(o);
        if (objCacheIt == styleSheetCaches->styleSheetCache.constEnd()) {
            parser.init(styleSheet);
            if (!parser.parse(&ss)) {
                parser.init("* {"_L1 + styleSheet + u'}');
                if (Q_UNLIKELY(!parser.parse(&ss)))
                   qWarning() << "Could not parse stylesheet of object" << o;
            }
            ss.origin = StyleSheetOrigin_Inline;
            styleSheetCaches->styleSheetCache.insert(o, ss);
        } else {
            ss = objCacheIt.value();
        }
        objectSs.append(ss);
    }

    for (int i = 0; i < objectSs.size(); i++)
        objectSs[i].depth = objectSs.size() - i + 2;

    styleSelector.styleSheets += objectSs;

    StyleSelector::NodePtr n;
    n.ptr = const_cast<QObject *>(obj);
    QList<QCss::StyleRule> rules = styleSelector.styleRulesForNode(n);
    styleSheetCaches->styleRulesCache.insert(obj, rules);
    return rules;
}